

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

bool __thiscall ON_Layer::Write(ON_Layer *this,ON_BinaryArchive *file)

{
  ON_LayerPrivate *pOVar1;
  element_type *peVar2;
  bool bVar3;
  bool b;
  bool bVar4;
  Type component_type;
  undefined1 uVar5;
  ON__UINT16 OVar6;
  ON_3dmArchiveTableType OVar7;
  int iVar8;
  ON__UINT32 OVar9;
  ON_UUID *pOVar10;
  wchar_t *pwVar11;
  ON_ComponentManifest *pOVar12;
  ON_ComponentManifestItem *this_00;
  uint s;
  ON_wString name;
  int local_a44;
  ON_wString sublayer_name;
  ON_NameHash sublayer_name_hash;
  ON_UUID parent_layer_id_1;
  ON_UUID parent_layer_id;
  
  bVar3 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0xf);
  if (!bVar3) {
    return false;
  }
  bVar3 = PersistentVisibility(this);
  b = PersistentLocking(this);
  iVar8 = b + 1;
  if (bVar3) {
    iVar8 = 0;
  }
  bVar4 = ON_BinaryArchive::WriteInt(file,iVar8);
  if (!bVar4) {
    return false;
  }
  bVar4 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,&this->super_ON_ModelComponent);
  if (((bVar4) && (bVar4 = ON_BinaryArchive::WriteInt(file,this->m_iges_level), bVar4)) &&
     (bVar4 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                        (file,Material,this->m_material_index), bVar4)) {
    bVar4 = ON_BinaryArchive::WriteInt(file,0);
    if (!bVar4) {
      return false;
    }
    bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_color);
    if (bVar4) {
      bVar4 = ON_BinaryArchive::WriteShort(file,0);
      if (!bVar4) {
        return false;
      }
      bVar4 = ON_BinaryArchive::WriteShort(file,0);
      if (!bVar4) {
        return false;
      }
      bVar4 = ON_BinaryArchive::WriteDouble(file,0.0);
      if ((bVar4) && (bVar4 = ON_BinaryArchive::WriteDouble(file,1.0), bVar4)) {
        OVar7 = ON_BinaryArchive::Active3dmTable(file);
        if (((OVar7 == layer_table) &&
            ((iVar8 = ON_BinaryArchive::Archive3dmVersion(file), iVar8 < 5 &&
             (bVar4 = ON_ModelComponent::NameIsNotEmpty(&this->super_ON_ModelComponent), bVar4))))
           && (bVar4 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent), bVar4))
        {
          ON_ModelComponent::Name((ON_ModelComponent *)&name);
          pOVar10 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
          parent_layer_id_1.Data1 = pOVar10->Data1;
          parent_layer_id_1.Data2 = pOVar10->Data2;
          parent_layer_id_1.Data3 = pOVar10->Data3;
          parent_layer_id_1.Data4 = *&pOVar10->Data4;
          OVar6 = ON_CRC16(0,0x10,&parent_layer_id_1);
          s = (uint)OVar6;
          ON_RandomNumberGenerator::ON_RandomNumberGenerator
                    ((ON_RandomNumberGenerator *)&parent_layer_id);
          ON_RandomNumberGenerator::Seed((ON_RandomNumberGenerator *)&parent_layer_id,s);
          local_a44 = 0;
          do {
            if (local_a44 == 100) break;
            while ((short)s == 0) {
              OVar9 = ON_RandomNumberGenerator::RandomNumber
                                ((ON_RandomNumberGenerator *)&parent_layer_id);
              s = OVar9 % 0xffff;
            }
            ON_wString::ON_wString(&sublayer_name);
            pwVar11 = ON_wString::operator_cast_to_wchar_t_(&name);
            ON_wString::Format(&sublayer_name,L"%ls (%04x)",pwVar11,(ulong)s);
            ON_NameHash::Create(&sublayer_name_hash,&ON_nil_uuid,&sublayer_name);
            pOVar12 = ON_BinaryArchive::Manifest(file);
            component_type = ON_ModelComponent::ComponentType(&this->super_ON_ModelComponent);
            this_00 = ON_ComponentManifest::ItemFromNameHash
                                (pOVar12,component_type,&sublayer_name_hash);
            bVar4 = ON_ComponentManifestItem::IsUnset(this_00);
            if (bVar4) {
              ON_wString::operator=(&name,&sublayer_name);
              pOVar12 = ON_BinaryArchive::Manifest(file);
              pOVar10 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
              ON_ComponentManifest::ChangeComponentNameHash(pOVar12,*pOVar10,&sublayer_name_hash);
            }
            else {
              OVar9 = ON_RandomNumberGenerator::RandomNumber
                                ((ON_RandomNumberGenerator *)&parent_layer_id);
              s = OVar9 % 0xffff;
            }
            ON_wString::~ON_wString(&sublayer_name);
            local_a44 = local_a44 + 1;
          } while (!bVar4);
          uVar5 = ON_BinaryArchive::WriteString(file,&name);
          ON_wString::~ON_wString(&name);
        }
        else {
          uVar5 = ON_BinaryArchive::WriteModelComponentName(file,&this->super_ON_ModelComponent);
        }
        if ((((((bool)uVar5) && (bVar3 = ON_BinaryArchive::WriteBool(file,bVar3), bVar3)) &&
             (bVar3 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                (file,LinePattern,this->m_linetype_index), bVar3)) &&
            ((bVar3 = ON_BinaryArchive::WriteColor(file,&this->m_plot_color), bVar3 &&
             (bVar3 = ON_BinaryArchive::WriteDouble(file,this->m_plot_weight_mm), bVar3)))) &&
           (bVar3 = ON_BinaryArchive::WriteBool(file,b), bVar3)) {
          pOVar10 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
          bVar3 = ON_BinaryArchive::WriteUuid(file,pOVar10);
          if (bVar3) {
            parent_layer_id = ParentLayerId(this);
            bVar3 = ON_BinaryArchive::WriteUuid(file,&parent_layer_id);
            if (((bVar3) && (bVar3 = ON_BinaryArchive::WriteBool(file,this->m_bExpanded), bVar3)) &&
               ((bVar3 = ON_RenderingAttributes::Write(&this->m_rendering_attributes,file), bVar3 &&
                (bVar3 = ON_BinaryArchive::WriteUuid(file,&this->m_display_material_id), bVar3)))) {
              pOVar1 = this->m_private;
              if (pOVar1 != (ON_LayerPrivate *)0x0) {
                peVar2 = (pOVar1->m_custom_section_style).
                         super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                if (pOVar1->m_visible_in_new_details == false) {
                  bVar3 = ON_BinaryArchive::WriteChar(file,'\"');
                  if (!bVar3) {
                    return false;
                  }
                  if (this->m_private == (ON_LayerPrivate *)0x0) {
                    bVar3 = true;
                  }
                  else {
                    bVar3 = this->m_private->m_visible_in_new_details;
                  }
                  bVar3 = ON_BinaryArchive::WriteBool(file,bVar3);
                  if (!bVar3) {
                    return false;
                  }
                }
                if (peVar2 != (element_type *)0x0) {
                  bVar3 = ON_BinaryArchive::WriteChar(file,'#');
                  if (!bVar3) {
                    return false;
                  }
                  iVar8 = (*(peVar2->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10])
                                    (peVar2);
                  if ((char)iVar8 == '\0') {
                    return false;
                  }
                }
              }
              bVar3 = ON_BinaryArchive::WriteChar(file,'\0');
              return bVar3;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Layer::Write(
       ON_BinaryArchive& file // serialize definition to binary archive
     ) const
{
  int i;

  // 11 May 2023 S. Baer
  // Do not write a minor chunk version greater than 15. Chunk versions are actually
  // two values packed into a single unsigned char. The use of type codes for I/O
  // with layers makes it so the minor version isn't really necessary. Just stop at
  // a minor version of 15
  bool rc = file.Write3dmChunkVersion(1,15);
  while(rc)
  {
    // Save the visibility state this layer has when its parent
    // is visible ignoring current parent visibility value.
    bool bVisible = PersistentVisibility();

    // Save the locked state this layer has when its parent
    // is unlocked ignoring current parenting locked setting.
    const bool bLocked = PersistentLocking();

    // Save OBSOLETE mode value so we don't break file format
    if ( bVisible )
      i = 0; // "normal" layer mode
    else if ( bLocked )
      i = 2; // "locked" layer mode
    else
      i = 1; // "hidden" layer mode

    rc = file.WriteInt( i );
    if (!rc) break;

    rc = file.Write3dmReferencedComponentIndex( *this );
    if (!rc) break;

    rc = file.WriteInt( m_iges_level );
    if (!rc) break;

    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderMaterial, m_material_index );
    if (!rc) break;

    // Starting with version 200312110, this value is zero.  For files written
    // with earlier versions, the number was a "model index" value that was
    // set to something >= 1, but never used.  We have to continue to 
    // read/write an integer here so that old/new versions of opennurbs can
    // read files written by new/old versions.
    i = 0;
    rc = file.WriteInt( i );
    if (!rc) break;

    rc = file.WriteColor( m_color );
    if (!rc) break;
    
    {
      // OBSOLETE LINE STYLE if ( rc ) rc = file.WriteLineStyle( LineStyle() );
      // Starting with version 200503170, this section is "officially" not used.
      // Prior to that, it was old ON_LineStyle information that has
      // never been used.
      short s = 0;
      if (rc) rc = file.WriteShort(s);    // default pattern
      if (rc) rc = file.WriteShort(s);    // default pattern index
      if (rc) rc = file.WriteDouble(0.0); // default thickness
      if (rc) rc = file.WriteDouble(1.0); // default scale
    }
    if (!rc) break;

    if (
      file.Active3dmTable() == ON_3dmArchiveTableType::layer_table
      && file.Archive3dmVersion() <= 4
      && NameIsNotEmpty()
      && ParentIdIsNotNil()
      )
    {
      ON_wString name = Name();
      // In V4 there are no parent layers and all V4 layer names must be unique.
      // Since layers can be written in any order, we cannot know if there will
      // eventually be a parent layer using the same name as this child layer.
      // So, child layer names get a hash appended to insure they are unique.
      ON_UUID parent_layer_id = ParentId();
      ON__UINT16 hash = ON_CRC16(0, sizeof(parent_layer_id), &parent_layer_id);
      ON_RandomNumberGenerator rng;
      rng.Seed(hash);
      for (int attempt_count = 0; attempt_count < 100; attempt_count++)
      {
        while ( 0 == hash )
          hash = (ON__UINT16)(rng.RandomNumber() % 0xFFFFU);
        ON_wString sublayer_name;
        sublayer_name.Format(L"%ls (%04x)", static_cast<const wchar_t*>(name),hash);
        
        // Use ON_nil_uuid ast the parent id because we need a name that is uniques
        // as a "top level" layer name for V4 files.
        const ON_NameHash sublayer_name_hash = ON_NameHash::Create(ON_nil_uuid,sublayer_name);

        if ( file.Manifest().ItemFromNameHash(ComponentType(), sublayer_name_hash).IsUnset() )
        {
          // have a unique name
          name = sublayer_name;
          const_cast< ON_ComponentManifest& >(file.Manifest()).ChangeComponentNameHash(Id(), sublayer_name_hash);
          break;
        }
        hash = (ON__UINT16)(rng.RandomNumber() % 0xFFFFU);
      }
      rc = file.WriteString( name );
    }
    else
    {
      rc = file.WriteModelComponentName(*this);
    }

    if (!rc) break;

    // 1.1 fields
    rc = file.WriteBool(bVisible);
    if (!rc) break;

    // 1.2 field
    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, m_linetype_index );
    if (!rc) break;

    // 1.3 field - 23 March 2005 Dale Lear
    rc = file.WriteColor( m_plot_color);
    if (!rc) break;
    rc = file.WriteDouble( m_plot_weight_mm);
    if (!rc) break;

    // 1.4 field - 3 May 2005 Dale Lear 
    //           - locked and visible are independent settings
    rc = file.WriteBool( bLocked );
    if (!rc) break;

    // 1.5 field
    rc = file.WriteUuid( Id() );
    if (!rc) break;

    // 1.6 field
    ON_UUID parent_layer_id = ParentLayerId();
    rc = file.WriteUuid( parent_layer_id );
    if (!rc) break;

    // 1.6 field
    rc = file.WriteBool( m_bExpanded );
    if (!rc) break;

    // 1.7 field - added 6 June 2006
    rc = m_rendering_attributes.Write(file);
    if (!rc) break;

    // 1.8 field - added 19 Sep 2006
    rc = file.WriteUuid(m_display_material_id);
    if (!rc) break;

    // 1.10 field - added 29 Sep 2021
    // using ON_3dmObjectAttributes inspired technique for writing only
    // non-default values to 3dm files
    unsigned char c = 0;

    // selective clipping (1.10)
    //{
    //  bool forAllClippingPlanes = true;
    //  bool forNoClippingPlanes = false;
    //  ON_UuidList selectiveList;
    //  bool isParticipationList = true;
    //  GetClipParticipation(forAllClippingPlanes, forNoClippingPlanes, selectiveList, isParticipationList);
    //  // only write selective clipping data if it is not default
    //  if (false == forAllClippingPlanes || true == forNoClippingPlanes || selectiveList.Count() > 0)
    //  {
    //    c = ON_LayerTypeCodes::SelectiveClippingData;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteBool(forNoClippingPlanes);
    //    if (!rc) break;
    //    rc = selectiveList.Write(file);
    //    if (!rc) break;
    //  }
    //}

    // 23 April 2023 S. Baer
    // Stop writing individual section attributes. All section attribute IO has been
    // moved to writing an ON_SectionStyle instance
    // section hatch (1.11)
    const ON_SectionStyle* section_style = CustomSectionStyle();
    //if (section_style)
    //{
    //  if (section_style->HatchIndex() != ON_UNSET_INT_INDEX)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchIndex;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, section_style->HatchIndex());
    //    if (!rc) break;
    //  }
    //  if (section_style->HatchScale() != 1.0)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchScale;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteDouble(section_style->HatchScale());
    //    if (!rc) break;
    //  }
    //  if (section_style->HatchRotation() != 0.0)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchRotation;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteDouble(section_style->HatchRotation());
    //    if (!rc) break;
    //  }

    //  // section fill (1.12)
    //  if (section_style->SectionFillRule() != ON::SectionFillRule::ClosedCurves)
    //  {
    //    c = ON_LayerTypeCodes::SectionFillRule; //32
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteChar((unsigned char)section_style->SectionFillRule());
    //    if (!rc) break;
    //  }
    //}

    // custom linetype (1.13)
    // 17 Feb 2023 S. Baer
    // Custom linetypes were an experiment that ended up making the UI more complicated
    // than necessary. Do not write any custom linetype data into the 3dm file.
    //{
    //  const ON_Linetype* linetype = CustomLinetype();
    //  if (linetype)
    //  {
    //    c = ON_LayerTypeCodes::CustomLinetype; // 33
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = linetype->Write(file);
    //    if (!rc) break;
    //  }
    //}

    // visible in new detail (1.14)
    if (PerViewportIsVisibleInNewDetails() != DefaultLayerPrivate.m_visible_in_new_details)
    {
      c = ON_LayerTypeCodes::PerViewportIsVisibleInNewDetails; //34
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(PerViewportIsVisibleInNewDetails());
      if (!rc) break;
    }

    if (section_style)
    {
      c = ON_LayerTypeCodes::CustomSectionStyle; //35
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = section_style->Write(file);
      if (!rc) break;
    }

    //if (m_private && false == m_private->m_clipplane_list_is_participation)
    //{
    //  c = ON_LayerTypeCodes::SelectiveClippingListType; //36
    //  rc = file.WriteChar(c);
    //  if (!rc) break;
    //  rc = file.WriteBool(m_private->m_clipplane_list_is_participation);
    //  if (!rc) break;
    //}

    // 0 indicates end of new non-default attributes
    c = 0;
    rc = file.WriteChar(c);

    break;
  }

  return rc;
}